

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O3

int __thiscall nuraft::snapshot_io_mgr::shutdown(snapshot_io_mgr *this,int __fd,int __how)

{
  __int_type_conflict1 _Var1;
  undefined4 in_EAX;
  int iVar2;
  
  LOCK();
  _Var1 = (this->terminating_)._M_base._M_i;
  (this->terminating_)._M_base._M_i = true;
  UNLOCK();
  if ((this->io_thread_)._M_id._M_thread != 0) {
    EventAwaiter::invoke
              ((this->io_thread_ea_).
               super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar2 = std::thread::join();
    return iVar2;
  }
  return CONCAT31((int3)((uint)in_EAX >> 8),_Var1);
}

Assistant:

void snapshot_io_mgr::shutdown() {
    terminating_ = true;
    if (io_thread_.joinable()) {
        io_thread_ea_->invoke();
        io_thread_.join();
    }
}